

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QPoint __thiscall
QListModeViewBase::initStaticLayout(QListModeViewBase *this,QListViewLayoutInfo *info)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  long in_FS_OFFSET;
  int y;
  int x;
  QList<int> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  QPoint local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RSI + 0x1c) == 0) {
    QList<int>::clear((QList<int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QList<int>::clear((QList<int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QList<int>::clear((QList<int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QList<int>::clear((QList<int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QList<int>::clear((QList<int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar2 = QRect::left((QRect *)0x883e1c);
    in_stack_ffffffffffffffc4 = iVar2 + *(int *)(in_RSI + 0x18);
    iVar2 = QRect::top((QRect *)0x883e32);
    if (*(int *)(in_RSI + 0x28) == 0) {
      in_stack_ffffffffffffffc4 = iVar2 + *(int *)(in_RSI + 0x18);
    }
    QList<int>::append((QList<int> *)0x883e79,
                       (parameter_type)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    QList<int>::append((QList<int> *)0x883e89,
                       (parameter_type)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  }
  else if ((*(byte *)(in_RSI + 0x24) & 1) == 0) {
    if (*(int *)(in_RSI + 0x28) == 0) {
      QRect::top((QRect *)0x883f10);
    }
    else {
      QRect::left((QRect *)0x883f28);
    }
  }
  else if (*(int *)(in_RSI + 0x28) == 0) {
    QList<int>::constLast(in_stack_ffffffffffffffb8);
  }
  else {
    QList<int>::constLast(in_stack_ffffffffffffffb8);
  }
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QPoint QListModeViewBase::initStaticLayout(const QListViewLayoutInfo &info)
{
    int x, y;
    if (info.first == 0) {
        flowPositions.clear();
        segmentPositions.clear();
        segmentStartRows.clear();
        segmentExtents.clear();
        scrollValueMap.clear();
        x = info.bounds.left() + info.spacing;
        y = info.bounds.top() + info.spacing;
        segmentPositions.append(info.flow == QListView::LeftToRight ? y : x);
        segmentStartRows.append(0);
    } else if (info.wrap) {
        if (info.flow == QListView::LeftToRight) {
            x = batchSavedPosition;
            y = segmentPositions.constLast();
        } else { // flow == QListView::TopToBottom
            x = segmentPositions.constLast();
            y = batchSavedPosition;
        }
    } else { // not first and not wrap
        if (info.flow == QListView::LeftToRight) {
            x = batchSavedPosition;
            y = info.bounds.top() + info.spacing;
        } else { // flow == QListView::TopToBottom
            x = info.bounds.left() + info.spacing;
            y = batchSavedPosition;
        }
    }
    return QPoint(x, y);
}